

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

int loop(uchar *pattern,uchar *string,int maxstars)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  uchar *pp;
  byte local_158 [12];
  int local_14c;
  uchar charset [271];
  
  local_14c = maxstars;
  memset(charset,0,0x10f);
  do {
    bVar6 = *pattern;
    uVar2 = 1;
    if (bVar6 == 0x3f) {
      if (*string == 0) {
        return 1;
      }
LAB_001247fd:
      pattern = pattern + 1;
    }
    else if (bVar6 == 0x5b) {
      iVar3 = 0;
      pp = pattern + 1;
      memset(charset,0,0x10f);
      bVar1 = false;
      pbVar5 = pattern + 1;
LAB_001244b9:
      while( true ) {
        pbVar9 = pbVar5;
        bVar6 = *pbVar9;
        uVar8 = (ulong)bVar6;
        if (bVar6 == 0) {
          return 1;
        }
        if (iVar3 == 2) {
          if (bVar6 != 0x5d) {
            charset[uVar8] = '\x01';
            goto LAB_00124618;
          }
          goto LAB_00124808;
        }
        uVar7 = (uint)bVar6;
        if (iVar3 != 1) goto code_r0x001244d8;
        if (uVar8 != 0x5b) break;
        charset[0x5b] = '\x01';
        pp = pbVar9 + 1;
        iVar3 = 2;
        pbVar5 = pp;
      }
      if (bVar6 != 0x5d) {
        iVar3 = Curl_isprint(uVar7);
        if (iVar3 == 0) {
          return 1;
        }
        charset[uVar7] = '\x01';
        goto LAB_00124618;
      }
LAB_00124808:
      bVar6 = *string;
      if (bVar6 == 0) {
        return 1;
      }
      if (charset[bVar6] == '\0') {
        uVar2 = (uint)bVar6;
        if (charset[0x101] == '\0') {
          if (charset[0x104] == '\0') {
            if (charset[0x102] == '\0') {
              if (charset[0x103] == '\0') {
                if (charset[0x105] == '\0') {
                  if (charset[0x109] == '\0') {
                    if (charset[0x10a] == '\0') {
                      if (charset[0x107] == '\0') {
                        if (charset[0x106] == '\0') {
                          if (charset[0x108] == '\0') {
                            uVar2 = 0;
                          }
                          else {
                            uVar2 = Curl_isgraph(uVar2);
                          }
                        }
                        else {
                          uVar2 = (uint)(uVar2 == 9 || uVar2 == 0x20);
                        }
                      }
                      else {
                        uVar2 = Curl_islower(uVar2);
                      }
                    }
                    else {
                      uVar2 = Curl_isupper(uVar2);
                    }
                  }
                  else {
                    uVar2 = Curl_isspace(uVar2);
                  }
                }
                else {
                  uVar2 = Curl_isprint(uVar2);
                }
              }
              else {
                uVar2 = Curl_isxdigit(uVar2);
              }
            }
            else {
              uVar2 = Curl_isdigit(uVar2);
            }
          }
          else {
            uVar2 = Curl_isalpha(uVar2);
          }
        }
        else {
          uVar2 = Curl_isalnum(uVar2);
        }
      }
      uVar7 = (uint)(uVar2 == 0);
      if (charset[0x100] == '\0') {
        uVar7 = uVar2;
      }
      if (uVar7 == 0) {
        return 1;
      }
      pattern = pbVar9 + 1;
    }
    else {
      if (bVar6 != 0x5c) {
        if (bVar6 == 0) {
          return (uint)(*string != 0);
        }
        if (bVar6 == 0x2a) {
          if (local_14c == 0) {
            return 1;
          }
          do {
            do {
              bVar6 = pattern[1];
              pattern = pattern + 1;
            } while (bVar6 == 0x2a);
            if (bVar6 == 0) {
              return 0;
            }
            if (bVar6 != 0x3f) {
              local_14c = local_14c + -1;
              do {
                if (*string == 0) {
                  return 1;
                }
                iVar3 = loop(pattern,string,local_14c);
                string = string + 1;
              } while (iVar3 != 0);
              return 0;
            }
            bVar6 = *string;
            string = string + 1;
          } while (bVar6 != 0);
          return 1;
        }
        if (bVar6 != *string) {
          return 1;
        }
        goto LAB_001247fd;
      }
      bVar6 = pattern[1];
      pbVar5 = pattern + 1;
      if (bVar6 == 0) {
        bVar6 = 0x5c;
        pbVar5 = pattern;
      }
      if (*string != bVar6) {
        return 1;
      }
      pattern = pbVar5 + 1;
    }
    string = string + 1;
  } while( true );
code_r0x001244d8:
  pbVar5 = pp;
  if (iVar3 != 0) goto LAB_001244b9;
  switch(bVar6) {
  case 0x5b:
    if (pbVar9[1] == 0x3a) {
      local_158[8] = 0;
      local_158[9] = 0;
      local_158[0] = 0;
      local_158[1] = 0;
      local_158[2] = 0;
      local_158[3] = 0;
      local_158[4] = 0;
      local_158[5] = 0;
      local_158[6] = 0;
      local_158[7] = 0;
      lVar10 = 0;
      uVar7 = 0;
      bVar1 = false;
      while (!bVar1) {
        if (lVar10 == 10) goto LAB_001247a9;
        bVar6 = pbVar9[lVar10 + 2];
        if (uVar7 == 0) {
          iVar3 = Curl_islower((uint)bVar6);
          if (iVar3 == 0) {
            bVar1 = false;
            uVar7 = uVar2;
            if (bVar6 != 0x3a) goto LAB_001247a9;
          }
          else {
            local_158[lVar10] = bVar6;
            bVar1 = false;
            uVar7 = 0;
          }
        }
        else {
          bVar1 = true;
          uVar7 = uVar2;
          if (bVar6 != 0x5d) goto LAB_001247a9;
        }
        lVar10 = lVar10 + 1;
      }
      iVar3 = bcmp(local_158,"digit",6);
      puVar4 = charset + 0x102;
      if (iVar3 != 0) {
        iVar3 = bcmp(local_158,"alnum",6);
        puVar4 = charset + 0x101;
        if (iVar3 != 0) {
          iVar3 = bcmp(local_158,"alpha",6);
          puVar4 = charset + 0x104;
          if (iVar3 != 0) {
            iVar3 = bcmp(local_158,"xdigit",7);
            puVar4 = charset + 0x103;
            if (iVar3 != 0) {
              iVar3 = bcmp(local_158,"print",6);
              puVar4 = charset + 0x105;
              if (iVar3 != 0) {
                iVar3 = bcmp(local_158,"graph",6);
                puVar4 = charset + 0x108;
                if (iVar3 != 0) {
                  iVar3 = bcmp(local_158,"space",6);
                  puVar4 = charset + 0x109;
                  if (iVar3 != 0) {
                    iVar3 = bcmp(local_158,"blank",6);
                    puVar4 = charset + 0x106;
                    if (iVar3 != 0) {
                      iVar3 = bcmp(local_158,"upper",6);
                      puVar4 = charset + 0x10a;
                      if (iVar3 != 0) {
                        iVar3 = bcmp(local_158,"lower",6);
                        puVar4 = charset + 0x107;
                        if (iVar3 != 0) goto LAB_001247a9;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pp = pbVar9 + lVar10 + 2;
      *puVar4 = '\x01';
    }
    else {
LAB_001247a9:
      pp = pbVar9 + 1;
      charset[0x5b] = '\x01';
    }
    break;
  case 0x5c:
    pp = pbVar9 + 1;
    if (pbVar9[1] == 0) {
      charset[0x5c] = '\x01';
    }
    else {
LAB_001245e4:
      setcharorrange(&pp,charset);
    }
    break;
  case 0x5d:
    if (bVar1) goto LAB_00124808;
    charset[0x5d] = '\x01';
    pp = pbVar9 + 1;
    bVar1 = true;
    iVar3 = 1;
    pbVar5 = pp;
    goto LAB_001244b9;
  case 0x5e:
    goto switchD_001244fa_caseD_5e;
  default:
    if (uVar7 != 0x21) goto LAB_001245e4;
    goto switchD_001244fa_caseD_5e;
  }
  bVar1 = true;
LAB_001247bc:
  iVar3 = 0;
  pbVar5 = pp;
  goto LAB_001244b9;
switchD_001244fa_caseD_5e:
  if (bVar1) {
    puVar4 = charset + uVar8;
  }
  else {
    puVar4 = charset + 0x100;
    if (charset[0x100] != '\0') {
      puVar4 = charset + uVar8;
      bVar1 = true;
    }
  }
  *puVar4 = '\x01';
LAB_00124618:
  pp = pbVar9 + 1;
  goto LAB_001247bc;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}